

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O2

string * __thiscall
RatioSequence::toString_abi_cxx11_(string *__return_storage_ptr__,RatioSequence *this)

{
  pointer pRVar1;
  pointer pRVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  ostringstream ss;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    pRVar1 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar2 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)pRVar2 - (long)pRVar1 >> 6) - 1U <= uVar4) break;
    Ratio::toString_abi_cxx11_(&local_1c8,(Ratio *)((long)&pRVar1->eLength + lVar5));
    poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_1c8);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x40;
  }
  Ratio::toString_abi_cxx11_(&local_1c8,pRVar2 + -1);
  std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string RatioSequence::toString() {
    ostringstream ss;
    for (size_t i = 0; i < _RatioSequence.size() - 1; ++i) {
        ss << _RatioSequence[i].toString() << " ";
    }
    ss << _RatioSequence.back().toString();
    return ss.str();
}